

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

string * __thiscall
gvr::(anonymous_namespace)::PLYProperty::toString_abi_cxx11_
          (string *__return_storage_ptr__,PLYProperty *this)

{
  ply_type in_EDX;
  ply_type type;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (*(uint *)(this + 0x28) == 0) {
    type2Name_abi_cxx11_(&local_98,(PLYProperty *)(ulong)*(uint *)(this + 0x2c),in_EDX);
    std::operator+(&bStack_d8,"property ",&local_98);
    std::operator+(&local_b8,&bStack_d8," ");
    std::operator+(__return_storage_ptr__,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 8));
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&bStack_d8);
    this_00 = &local_98;
  }
  else {
    type2Name_abi_cxx11_(&local_38,(PLYProperty *)(ulong)*(uint *)(this + 0x28),in_EDX);
    std::operator+(&local_58,"property list ",&local_38);
    std::operator+(&local_98,&local_58," ");
    type2Name_abi_cxx11_(&local_78,(PLYProperty *)(ulong)*(uint *)(this + 0x2c),type);
    std::operator+(&bStack_d8,&local_98,&local_78);
    std::operator+(&local_b8,&bStack_d8," ");
    std::operator+(__return_storage_ptr__,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 8));
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&bStack_d8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    this_00 = &local_38;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string PLYProperty::toString() const
{
  if (tsize == ply_none)
  {
    return "property "+type2Name(tvalue)+" "+name;
  }
  else
  {
    return "property list "+type2Name(tsize)+" "+type2Name(tvalue)+" "+name;
  }
}